

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

int rndtrap(level *lev)

{
  boolean bVar1;
  int local_14;
  int rtrap;
  level *lev_local;
  
  do {
    local_14 = rnd(0x18);
    switch(local_14) {
    case 3:
    case 7:
      if ((lev->z).dnum == dungeon_topology.d_astral_level.dnum) {
        local_14 = 0;
      }
      break;
    case 0xd:
    case 0xf:
    case 0x12:
      local_14 = 0;
      break;
    case 0xe:
      bVar1 = can_dig_down(lev);
      if (bVar1 == '\0') {
        local_14 = 0;
      }
      break;
    case 0x10:
    case 0x11:
      if ((*(uint *)&(lev->flags).field_0x8 >> 0xb & 1) != 0) {
        local_14 = 0;
      }
    }
  } while (local_14 == 0);
  return local_14;
}

Assistant:

static int rndtrap(struct level *lev)
{
	int rtrap;

	do {
	    rtrap = rnd(TRAPNUM-1);
	    switch (rtrap) {
	     case HOLE:		/* no random holes on special levels */
             case VIBRATING_SQUARE:
	     case MAGIC_PORTAL:	rtrap = NO_TRAP;
				break;
	     case TRAPDOOR:	if (!can_dig_down(lev)) rtrap = NO_TRAP;
				break;
	     case LEVEL_TELEP:
	     case TELEP_TRAP:	if (lev->flags.noteleport) rtrap = NO_TRAP;
				break;
	     case ROLLING_BOULDER_TRAP:
	     case ROCKTRAP:	if (In_endgame(&lev->z)) rtrap = NO_TRAP;
				break;
	    }
	} while (rtrap == NO_TRAP);
	return rtrap;
}